

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.h
# Opt level: O0

Vector3f * phyr::reflect(Vector3f *wo,Vector3f *n)

{
  Vector3<double> *in_RDX;
  Vector3<double> *in_RSI;
  Vector3<double> *in_RDI;
  Vector3<double> *in_stack_ffffffffffffffa8;
  Vector3<double> *this;
  
  this = in_RDI;
  Vector3<double>::operator-(in_RDI);
  dot<double>(in_RSI,in_RDX);
  operator*((double)this,in_stack_ffffffffffffffa8);
  Vector3<double>::operator+(this,in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

inline Vector3f reflect(const Vector3f& wo, const Vector3f& n) {
    return -wo + 2 * dot(wo, n) * n;
}